

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FIShortValueImpl::~FIShortValueImpl(FIShortValueImpl *this)

{
  ~FIShortValueImpl(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

inline FIShortValueImpl(std::vector<int16_t> &&value_): strValueValid(false) { value = std::move(value_); }